

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O2

TA_RetCode
TA_ULTOSC_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_ParamHolderInput *pTVar1;
  TA_ParamHolderOptInput *pTVar2;
  TA_RetCode TVar3;
  
  pTVar1 = params->in;
  pTVar2 = params->optIn;
  TVar3 = TA_ULTOSC(startIdx,endIdx,(pTVar1->data).inPrice.high,(pTVar1->data).inPrice.low,
                    (pTVar1->data).inPrice.close,(pTVar2->data).optInInteger,
                    pTVar2[1].data.optInInteger,pTVar2[2].data.optInInteger,outBegIdx,outNBElement,
                    (params->out->data).outReal);
  return TVar3;
}

Assistant:

TA_RetCode TA_ULTOSC_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_ULTOSC(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                params->in[0].data.inPrice.low, /* inLow */
/* Generated */                params->in[0].data.inPrice.close, /* inClose */
/* Generated */                params->optIn[0].data.optInInteger, /* optInTimePeriod1*/
/* Generated */                params->optIn[1].data.optInInteger, /* optInTimePeriod2*/
/* Generated */                params->optIn[2].data.optInInteger, /* optInTimePeriod3*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal /*  outReal */ );
/* Generated */ }